

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSources::ProcessSDESPrivateItem
          (RTPSources *this,uint32_t ssrc,size_t prefixlen,void *prefixdata,size_t valuelen,
          void *valuedata,RTPTime *receivetime,RTPAddress *senderaddress)

{
  int iVar1;
  bool created;
  bool local_41;
  size_t local_40;
  RTPInternalSourceData *local_38;
  
  local_40 = valuelen;
  iVar1 = GetRTCPSourceData(this,ssrc,senderaddress,&local_38,&local_41);
  if (-1 < iVar1) {
    if (local_38 == (RTPInternalSourceData *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = RTPInternalSourceData::ProcessPrivateSDESItem
                        (local_38,(uint8_t *)prefixdata,prefixlen,(uint8_t *)valuedata,local_40,
                         receivetime);
      if (local_41 == true) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,local_38);
      }
      if (-1 < iVar1) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xe])
                  (this,local_38,prefixdata,prefixlen,valuedata,local_40);
      }
    }
  }
  return iVar1;
}

Assistant:

int RTPSources::ProcessSDESPrivateItem(uint32_t ssrc,size_t prefixlen,const void *prefixdata,
                           size_t valuelen,const void *valuedata,const RTPTime &receivetime,
			   const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;

	status = srcdat->ProcessPrivateSDESItem((const uint8_t *)prefixdata,prefixlen,(const uint8_t *)valuedata,valuelen,receivetime);
	// Call the callback
	if (created)
		OnNewSource(srcdat);

	if (status >= 0)
		OnRTCPSDESPrivateItem(srcdat, prefixdata, prefixlen, valuedata, valuelen);

	return status;
}